

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateMPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  value_type *__x;
  size_type sVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int i_1;
  int k;
  int UendX;
  int UstartX;
  int pLogic;
  int i;
  int PFcountX0;
  value_type_conflict1 *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  value_type_conflict1 *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  undefined4 local_58;
  undefined4 local_40;
  undefined4 local_30;
  
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  for (local_30 = 0; local_30 < *(int *)(in_RSI + 0x84); local_30 = local_30 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x88),(long)local_30);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
               (value_type *)in_stack_ffffffffffffff58);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xa0),(long)local_30);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x398),(long)in_ECX);
  iVar1 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)iVar1);
  local_40 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 1000),(long)(iVar1 + 1));
  iVar2 = *pvVar4;
  for (; local_40 < iVar2; local_40 = local_40 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x418),(long)local_40);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
               (value_type *)in_stack_ffffffffffffff58);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x430),(long)local_40);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
             (value_type *)in_stack_ffffffffffffff58);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3c8),(long)iVar1);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,
             (value_type *)in_stack_ffffffffffffff48);
  for (local_58 = 0; local_58 < *(int *)(in_RDX + 0x84); local_58 = local_58 + 1) {
    in_stack_ffffffffffffff58 = (value_type_conflict1 *)(in_RDI + 0x508);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x88),(long)local_58);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
               (value_type *)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x520);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDX + 0xa0),(long)local_58);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  __x = (value_type *)(in_RDI + 0x4f0);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff50,__x);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_ECX);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(int *)(in_RDI + 0x3e4) =
       *(int *)(in_RSI + 0x84) + *(int *)(in_RDX + 0x84) + *(int *)(in_RDI + 0x3e4);
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + ((int)sVar5 - (int)sVar3);
  if (*(int *)(in_RDI + 0x3e0) < *(int *)(in_RDI + 0x3e4)) {
    *in_R8 = 1;
  }
  return;
}

Assistant:

void HFactor::updateMPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }
    int pLogic = UpivotLookup[iRow];
    int UstartX = Ustart[pLogic];
    int UendX = Ustart[pLogic + 1];
    for (int k = UstartX; k < UendX; k++) {
        PFindex.push_back(Uindex[k]);
        PFvalue.push_back(-Uvalue[k]);
    }
    PFindex.push_back(iRow);
    PFvalue.push_back(-UpivotValue[pLogic]);
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

    // Refactor or not
    UtotalX += aq->packCount + ep->packCount;
    FtotalX += PFindex.size() - PFcountX0;
    if (UtotalX > UmeritX)
        *hint = 1;
}